

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O2

void __thiscall
TEST_SimpleString_Addition_Test::TEST_SimpleString_Addition_Test
          (TEST_SimpleString_Addition_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupSimpleString).justNewForSimpleStringTestAllocator.
  super_TestMemoryAllocator.free_name_ = (char *)0x0;
  *(undefined8 *)
   &(this->super_TEST_GROUP_CppUTestGroupSimpleString).justNewForSimpleStringTestAllocator.
    super_TestMemoryAllocator.hasBeenDestroyed_ = 0;
  (this->super_TEST_GROUP_CppUTestGroupSimpleString).justNewForSimpleStringTestAllocator.
  super_TestMemoryAllocator.name_ = (char *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupSimpleString).justNewForSimpleStringTestAllocator.
  super_TestMemoryAllocator.alloc_name_ = (char *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupSimpleString).super_Utest._vptr_Utest = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupSimpleString).justNewForSimpleStringTestAllocator.
  super_TestMemoryAllocator._vptr_TestMemoryAllocator = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupSimpleString).stash.originalAllocator_ =
       (TestMemoryAllocator *)0x0;
  TEST_GROUP_CppUTestGroupSimpleString::TEST_GROUP_CppUTestGroupSimpleString
            (&this->super_TEST_GROUP_CppUTestGroupSimpleString);
  (this->super_TEST_GROUP_CppUTestGroupSimpleString).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupSimpleString_00364a18;
  return;
}

Assistant:

TEST(SimpleString, Addition)
{
    SimpleString s1("hello!");
    SimpleString s2("goodbye!");
    SimpleString s3("hello!goodbye!");
    SimpleString s4;
    s4 = s1 + s2;

    CHECK_EQUAL(s3, s4);
}